

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::HoistConstantLoadAndPropagateValueBackward
          (GlobOpt *this,Var varConst,Instr *origInstr,Value *value)

{
  code *pcVar1;
  bool bVar2;
  ValueType type;
  undefined4 *puVar3;
  StackSym *sym;
  BasicBlock *pBVar4;
  Instr *instr;
  RegOpnd *dst;
  StackSym *this_00;
  Value *value_00;
  Value *pVVar5;
  long lStack_b0;
  undefined1 local_a0 [8];
  InvariantBlockBackwardIterator it;
  
  if (this->prePassLoop != (Loop *)0x0) {
    return value;
  }
  if ((this->currentBlock == this->func->m_fg->blockList) &&
     (bVar2 = IR::Instr::TransfersSrcValue(origInstr), bVar2)) {
    return value;
  }
  bVar2 = Js::TaggedInt::Is(varConst);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x11b7,"(Js::TaggedInt::Is(varConst))","Js::TaggedInt::Is(varConst)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sym = StackSym::New(this->func);
  pBVar4 = (BasicBlock *)IR::RegOpnd::New(sym,TyVar,this->func);
  type = ValueType::GetInt(true);
  it.inclusiveEndBlock = pBVar4;
  instr = IR::Instr::NewConstantLoad((RegOpnd *)pBVar4,(intptr_t)varConst,type,this->func,(Var)0x0);
  IR::Instr::InsertAfter(this->func->m_fg->blockList->firstInstr,instr);
  bVar2 = Js::TaggedInt::Is(varConst);
  if ((!bVar2) || (bVar2 = IsTypeSpecPhaseOff(this->func), bVar2)) {
    BVSparse<Memory::JitArenaAllocator>::Set
              ((this->currentBlock->globOptData).liveVarSyms,(sym->super_Sym).m_id);
    lStack_b0 = 0x30;
  }
  else {
    instr->m_opcode = Ld_I4;
    dst = IR::Opnd::AsRegOpnd(instr->m_dst);
    ToInt32Dst(this,instr,dst,this->currentBlock);
    this_00 = IR::Opnd::GetStackSym(instr->m_dst);
    StackSym::SetIsConst(this_00);
    lStack_b0 = 0x38;
  }
  value_00 = GlobOptBlockData::InsertNewValue
                       (&this->currentBlock->globOptData,value,(Opnd *)it.inclusiveEndBlock);
  pBVar4 = this->func->m_fg->blockList;
  if (this->currentBlock != pBVar4) {
    InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
              ((InvariantBlockBackwardIterator *)local_a0,this,this->currentBlock,pBVar4,
               (StackSym *)0x0,0,false);
    while ((GlobOpt *)it._24_8_ != it.globOpt) {
      pBVar4 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_a0);
      BVSparse<Memory::JitArenaAllocator>::Set
                (*(BVSparse<Memory::JitArenaAllocator> **)
                  ((long)&(pBVar4->globOptData).symToValueMap + lStack_b0),(sym->super_Sym).m_id);
      pVVar5 = GlobOptBlockData::FindValue(&pBVar4->globOptData,&sym->super_Sym);
      if (pVVar5 == (Value *)0x0) {
        pVVar5 = CopyValue(this,value_00,value_00->valueNumber);
        GlobOptBlockData::SetValue(&pBVar4->globOptData,pVVar5,&sym->super_Sym);
      }
      InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_a0);
    }
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&it.invariantSymValue);
  }
  return value_00;
}

Assistant:

Value *
GlobOpt::HoistConstantLoadAndPropagateValueBackward(Js::Var varConst, IR::Instr * origInstr, Value * value)
{
    if (this->IsLoopPrePass() ||
        ((this->currentBlock == this->func->m_fg->blockList) &&
        origInstr->TransfersSrcValue()))
    {
        return value;
    }

    // Only hoisting taggable int const loads for now. Could be extended to other constants (floats, strings, addr opnds) if we see some benefit.
    Assert(Js::TaggedInt::Is(varConst));

    // Insert a load of the constant at the top of the function
    StackSym *    dstSym = StackSym::New(this->func);
    IR::RegOpnd * constRegOpnd = IR::RegOpnd::New(dstSym, TyVar, this->func);
    IR::Instr *   loadInstr = IR::Instr::NewConstantLoad(constRegOpnd, (intptr_t)varConst, ValueType::GetInt(true), this->func);
    this->func->m_fg->blockList->GetFirstInstr()->InsertAfter(loadInstr);

    // Type-spec the load (Support for floats needs to be added when we start hoisting float constants).
    bool typeSpecedToInt = false;
    if (Js::TaggedInt::Is(varConst) && !IsTypeSpecPhaseOff(this->func))
    {
        typeSpecedToInt = true;
        loadInstr->m_opcode = Js::OpCode::Ld_I4;
        ToInt32Dst(loadInstr, loadInstr->GetDst()->AsRegOpnd(), this->currentBlock);
        loadInstr->GetDst()->GetStackSym()->SetIsConst();
    }
    else
    {
        CurrentBlockData()->liveVarSyms->Set(dstSym->m_id);
    }

    // Add the value (object) to the current block's symToValueMap and propagate the value backward to all relevant blocks so it is available on merges.
    value = CurrentBlockData()->InsertNewValue(value, constRegOpnd);

    BVSparse<JitArenaAllocator>* GlobOptBlockData::*bv;
    bv = typeSpecedToInt ? &GlobOptBlockData::liveInt32Syms : &GlobOptBlockData::liveVarSyms; // Will need to be expanded when we start hoisting float constants.
    if (this->currentBlock != this->func->m_fg->blockList)
    {
        for (InvariantBlockBackwardIterator it(this, this->currentBlock, this->func->m_fg->blockList, nullptr);
             it.IsValid();
             it.MoveNext())
        {
            BasicBlock * block = it.Block();
            (block->globOptData.*bv)->Set(dstSym->m_id);
            if (!block->globOptData.FindValue(dstSym))
            {
                Value *const valueCopy = CopyValue(value, value->GetValueNumber());
                block->globOptData.SetValue(valueCopy, dstSym);
            }
        }
    }

    return value;
}